

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int64_t __thiscall
aeron::archive::AeronArchive::extendRecording
          (AeronArchive *this,int64_t recordingId,string *channel,int32_t streamId,
          Value sourceLocation)

{
  int64_t iVar1;
  anon_class_40_5_dd7885ce local_70;
  function<bool_(long)> local_48;
  Value local_28;
  int32_t local_24;
  Value sourceLocation_local;
  int32_t streamId_local;
  string *channel_local;
  int64_t recordingId_local;
  AeronArchive *this_local;
  
  local_70.streamId = &local_24;
  local_70.sourceLocation = &local_28;
  local_70.recordingId = (int64_t *)&channel_local;
  local_70.this = this;
  local_70.channel = channel;
  local_28 = sourceLocation;
  local_24 = streamId;
  _sourceLocation_local = channel;
  channel_local = (string *)recordingId;
  recordingId_local = (int64_t)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::extendRecording(long,std::__cxx11::string_const&,int,io::aeron::archive::codecs::SourceLocation::Value)::__0,void>
            ((function<bool(long)> *)&local_48,&local_70);
  iVar1 = callAndPollForResponse(this,&local_48,"extend recording");
  std::function<bool_(long)>::~function(&local_48);
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::extendRecording(std::int64_t recordingId, const std::string& channel, std::int32_t streamId,
                                           codecs::SourceLocation::Value sourceLocation) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return archiveProxy_->extendRecording(channel, streamId, sourceLocation, recordingId, correlationId,
                                                  controlSessionId_);
        },
        "extend recording");
}